

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> * __thiscall
CLI::App::get_subcommands
          (vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *__return_storage_ptr__,
          App *this,function<bool_(const_CLI::App_*)> *filter)

{
  pointer psVar1;
  pointer psVar2;
  __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
  __first;
  pointer ppAVar3;
  allocator_type local_19;
  
  std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::vector
            (__return_storage_ptr__,
             (long)(this->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->subcommands_).
                   super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4,&local_19);
  psVar1 = (this->subcommands_).
           super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  ppAVar3 = (__return_storage_ptr__->
            super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  for (psVar2 = (this->subcommands_).
                super__Vector_base<std::shared_ptr<CLI::App>,_std::allocator<std::shared_ptr<CLI::App>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar2 != psVar1; psVar2 = psVar2 + 1) {
    *ppAVar3 = (psVar2->super___shared_ptr<CLI::App,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    ppAVar3 = ppAVar3 + 1;
  }
  if ((filter->super__Function_base)._M_manager != (_Manager_type)0x0) {
    __first = ::std::
              __remove_if<__gnu_cxx::__normal_iterator<CLI::App_const**,std::vector<CLI::App_const*,std::allocator<CLI::App_const*>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::get_subcommands(std::function<bool(CLI::App_const*)>const&)const::_lambda(CLI::App_const*)_1_>>
                        ((__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                          )(__return_storage_ptr__->
                           super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>).
                           _M_impl.super__Vector_impl_data._M_start,
                         (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                          )(__return_storage_ptr__->
                           super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>).
                           _M_impl.super__Vector_impl_data._M_finish,
                         (_Iter_pred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_ERGO_Code[P]HiGHS_app_CLI11_hpp:8806:39)>
                          )filter);
    std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::erase
              (__return_storage_ptr__,(const_iterator)__first._M_current,
               (const_iterator)
               (__return_storage_ptr__->
               super__Vector_base<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>)._M_impl.
               super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::vector<const App *> App::get_subcommands(const std::function<bool(const App *)> &filter) const {
    std::vector<const App *> subcomms(subcommands_.size());
    std::transform(
        std::begin(subcommands_), std::end(subcommands_), std::begin(subcomms), [](const App_p &v) { return v.get(); });

    if(filter) {
        subcomms.erase(std::remove_if(std::begin(subcomms),
                                      std::end(subcomms),
                                      [&filter](const App *app) { return !filter(app); }),
                       std::end(subcomms));
    }

    return subcomms;
}